

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O3

void google::protobuf::compiler::cpp::anon_unknown_7::MaySetAnnotationVariable
               (Options *options,StringPiece annotation_name,StringPiece substitute_template_prefix,
               StringPiece prepared_template,int field_index,StringPiece access_type,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  const_iterator cVar1;
  size_t sVar2;
  mapped_type *this;
  AlphaNum *pAVar3;
  undefined4 in_register_0000008c;
  string local_370;
  string local_350;
  string local_330;
  StringPiece annotation_name_local;
  string local_300;
  SubstituteArg local_2d0;
  AlphaNum local_2a0;
  char *local_270;
  undefined8 local_268;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  annotation_name_local.length_ = annotation_name.length_;
  annotation_name_local.ptr_ = annotation_name.ptr_;
  pAVar3 = (AlphaNum *)substitute_template_prefix.length_;
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_300,&annotation_name_local);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(options->field_listener_options).forbidden_field_listener_events._M_t,&local_300)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(options->field_listener_options).forbidden_field_listener_events._M_t._M_impl.
       super__Rb_tree_header) {
    local_60.piece_size_ = (size_t)prepared_template.ptr_;
    local_90.piece_data_ = ");\n";
    local_90.piece_size_ = 3;
    local_300._M_dataplus._M_p = substitute_template_prefix.ptr_;
    local_300._M_string_length = (size_type)substitute_template_prefix.length_;
    local_60.piece_data_ = (char *)CONCAT44(in_register_0000008c,field_index);
    StrCat_abi_cxx11_(&local_350,(protobuf *)&local_300,&local_60,&local_90,pAVar3);
    local_2d0.text_ = FastInt32ToBuffer((int32)prepared_template.length_,local_2d0.scratch_);
    sVar2 = strlen(local_2d0.text_);
    local_2d0.size_ = (int)sVar2;
    pAVar3 = &local_c0;
    local_c0.piece_data_ = access_type.ptr_;
    local_c0.piece_size_._0_4_ = (undefined4)access_type.length_;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    strings::Substitute(&local_330,&local_350,&local_2d0,(SubstituteArg *)pAVar3,&local_f0,
                        &local_120,&local_150,&local_180,&local_1b0,&local_1e0,&local_210,&local_240
                       );
    local_270 = "annotate_";
    local_268 = 9;
    local_2a0.piece_data_ = annotation_name_local.ptr_;
    local_2a0.piece_size_ = annotation_name_local.length_;
    StrCat_abi_cxx11_(&local_370,(protobuf *)&local_270,&local_2a0,pAVar3);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_370);
    std::__cxx11::string::operator=((string *)this,(string *)&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void MaySetAnnotationVariable(const Options& options,
                              StringPiece annotation_name,
                              StringPiece substitute_template_prefix,
                              StringPiece prepared_template,
                              int field_index, StringPiece access_type,
                              std::map<std::string, std::string>* variables) {
  if (options.field_listener_options.forbidden_field_listener_events.count(
          std::string(annotation_name)))
    return;
  (*variables)[StrCat("annotate_", annotation_name)] = strings::Substitute(
      StrCat(substitute_template_prefix, prepared_template, ");\n"),
      field_index, access_type);
}